

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O3

void replay_all_hashes(ResourceTag tag,DatabaseInterface *db_iface,StateReplayer *replayer,
                      StateCreatorInterface *iface,
                      vector<unsigned_char,_std::allocator<unsigned_char>_> *state_json,
                      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *filter)

{
  DatabaseInterface *pDVar1;
  Hash *pHVar2;
  DatabaseInterface *pDVar3;
  int iVar4;
  _Hash_node_base *p_Var5;
  size_t size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  allocator_type local_59;
  size_type local_58;
  DatabaseInterface *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  if (filter != (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)0x0) {
    for (p_Var5 = (filter->_M_h)._M_before_begin._M_nxt; p_Var5 != (_Hash_node_base *)0x0;
        p_Var5 = p_Var5->_M_nxt) {
      replay_hash(tag,(Hash)p_Var5[1]._M_nxt,db_iface,replayer,iface,state_json);
    }
    return;
  }
  iVar4 = (*db_iface->_vptr_DatabaseInterface[6])(db_iface,tag,&local_58,0);
  if ((char)iVar4 != '\0') {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_48,local_58,&local_59)
    ;
    iVar4 = (*db_iface->_vptr_DatabaseInterface[6])
                      (db_iface,tag,&local_58,
                       local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    pDVar3 = db_iface;
    pDVar1 = local_50;
    pHVar2 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((char)iVar4 != '\0') {
      for (; local_50 = pDVar3,
          pHVar2 != local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pHVar2 = pHVar2 + 1) {
        replay_hash(tag,*pHVar2,local_50,replayer,iface,state_json);
        pDVar3 = local_50;
        pDVar1 = local_50;
      }
      if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start == (Hash *)0x0) {
        return;
      }
      local_50 = pDVar1;
      operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      return;
    }
  }
  exit(1);
}

Assistant:

static void replay_all_hashes(ResourceTag tag, DatabaseInterface &db_iface,
                              StateReplayer &replayer, StateCreatorInterface &iface,
                              vector<uint8_t> &state_json,
                              const unordered_set<Hash> *filter)
{
	if (filter)
	{
		for (auto hash : *filter)
			replay_hash(tag, hash, db_iface, replayer, iface, state_json);
	}
	else
	{
		size_t size;
		if (!db_iface.get_hash_list_for_resource_tag(tag, &size, nullptr))
			exit(EXIT_FAILURE);

		vector<Hash> hashes(size);
		if (!db_iface.get_hash_list_for_resource_tag(tag, &size, hashes.data()))
			exit(EXIT_FAILURE);

		for (auto hash : hashes)
			replay_hash(tag, hash, db_iface, replayer, iface, state_json);
	}
}